

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RandSequenceStatementSyntax::setChild
          (RandSequenceStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SyntaxList<slang::syntax::ProductionSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  NamedLabelSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  RandSequenceStatementSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_168 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    (this->super_StatementSyntax).label = local_168;
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_StatementSyntax).attributes,pSVar1);
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->randsequence).kind = (undefined2)local_28;
    (this->randsequence).field_0x2 = local_28._2_1_;
    (this->randsequence).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->randsequence).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->randsequence).info = local_20;
    break;
  case 3:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->openParen).kind = (undefined2)local_38;
    (this->openParen).field_0x2 = local_38._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openParen).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->openParen).info = local_30;
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->firstProduction).kind = (undefined2)local_48;
    (this->firstProduction).field_0x2 = local_48._2_1_;
    (this->firstProduction).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->firstProduction).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->firstProduction).info = local_40;
    break;
  case 5:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar4._0_8_;
    (this->closeParen).kind = (undefined2)local_58;
    (this->closeParen).field_0x2 = local_58._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->closeParen).rawLen = local_58._4_4_;
    local_50 = TVar4.info;
    (this->closeParen).info = local_50;
    break;
  case 6:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>>(pSVar2);
    SyntaxList<slang::syntax::ProductionSyntax>::operator=(&this->productions,pSVar3);
    break;
  case 7:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar4._0_8_;
    (this->endsequence).kind = (undefined2)local_68;
    (this->endsequence).field_0x2 = local_68._2_1_;
    (this->endsequence).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->endsequence).rawLen = local_68._4_4_;
    local_60 = TVar4.info;
    (this->endsequence).info = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x2add);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void RandSequenceStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: randsequence = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: firstProduction = child.token(); return;
        case 5: closeParen = child.token(); return;
        case 6: productions = child.node()->as<SyntaxList<ProductionSyntax>>(); return;
        case 7: endsequence = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}